

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreParsingUtils.h
# Opt level: O0

string * Assimp::Ogre::Trim(string *s,bool newlines)

{
  string *psVar1;
  bool newlines_local;
  string *s_local;
  
  psVar1 = TrimRight(s,newlines);
  psVar1 = TrimLeft(psVar1,newlines);
  return psVar1;
}

Assistant:

static AI_FORCE_INLINE
std::string &Trim(std::string &s, bool newlines = true) {
    return TrimLeft(TrimRight(s, newlines), newlines);
}